

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeCondition(TranslateToFuzzReader *this)

{
  bool bVar1;
  Type local_20;
  Unary *local_18;
  Expression *ret;
  TranslateToFuzzReader *this_local;
  
  ret = (Expression *)this;
  Type::Type(&local_20,i32);
  local_18 = (Unary *)make(this,local_20);
  bVar1 = oneIn(this,2);
  if (bVar1) {
    local_18 = Builder::makeUnary(&this->builder,EqZInt32,(Expression *)local_18);
  }
  return (Expression *)local_18;
}

Assistant:

Expression* TranslateToFuzzReader::makeCondition() {
  // We want a 50-50 chance for the condition to be taken, for interesting
  // execution paths. by itself, there is bias (e.g. most consts are "yes") so
  // even that out with noise
  auto* ret = make(Type::i32);
  if (oneIn(2)) {
    ret = builder.makeUnary(UnaryOp::EqZInt32, ret);
  }
  return ret;
}